

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O0

void output_example(vw *all,example *ec,bool *hit_loss,multi_ex *ec_seq)

{
  code *pcVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  _Ios_Openmode _Var5;
  ulong uVar6;
  size_t sVar7;
  int **ppiVar8;
  wclass *pwVar9;
  ostream *poVar10;
  byte *in_RDX;
  long in_RSI;
  long *in_RDI;
  size_t i;
  stringstream outputStringStream;
  string outputString;
  int sink;
  int *__end1;
  int *__begin1;
  v_array<int> *__range1;
  size_t j;
  uint32_t predicted_class;
  float loss;
  v_array<COST_SENSITIVE::wclass> costs;
  label *ld;
  example *in_stack_fffffffffffffce8;
  example *in_stack_fffffffffffffd08;
  string local_278 [32];
  ulong local_258;
  stringstream local_240 [16];
  ostream local_230;
  string local_b8 [32];
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  int local_74;
  multi_ex *pmVar11;
  multi_ex *ec_seq_00;
  example *ec_00;
  ulong in_stack_ffffffffffffffa8;
  undefined1 is_test;
  uint32_t uVar12;
  uint32_t uVar13;
  float fVar14;
  v_array<COST_SENSITIVE::wclass> local_48;
  undefined8 *local_28;
  byte *local_18;
  long local_10;
  long *local_8;
  
  local_28 = (undefined8 *)(in_RSI + 0x6828);
  local_48._begin = (wclass *)*local_28;
  local_48._end = *(wclass **)(in_RSI + 0x6830);
  local_48.end_array = *(wclass **)(in_RSI + 0x6838);
  local_48.erase_count = *(size_t *)(in_RSI + 0x6840);
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar4 = example_is_newline(in_stack_fffffffffffffce8);
  if ((iVar4 == 0) &&
     (bVar3 = COST_SENSITIVE::ec_is_example_header(in_stack_fffffffffffffd08), !bVar3)) {
    *(long *)(*local_8 + 0x10) = *(long *)(local_10 + 0x68a0) + *(long *)(*local_8 + 0x10);
    fVar14 = 0.0;
    uVar12 = *(uint32_t *)(local_10 + 0x6850);
    uVar6 = (*(code *)PTR_test_label_00476c80)(local_10 + 0x6828);
    if ((uVar6 & 1) == 0) {
      uVar6 = 0;
      while ((in_stack_ffffffffffffffa8 = uVar6,
             sVar7 = v_array<COST_SENSITIVE::wclass>::size(&local_48), uVar6 < sVar7 &&
             ((*local_18 & 1) == 0))) {
        uVar13 = uVar12;
        pwVar9 = v_array<COST_SENSITIVE::wclass>::operator[](&local_48,in_stack_ffffffffffffffa8);
        if (uVar12 == pwVar9->class_index) {
          pwVar9 = v_array<COST_SENSITIVE::wclass>::operator[](&local_48,in_stack_ffffffffffffffa8);
          fVar14 = pwVar9->x;
          *local_18 = 1;
        }
        uVar6 = in_stack_ffffffffffffffa8 + 1;
        uVar12 = uVar13;
      }
      *(double *)(*local_8 + 0x40) = (double)fVar14 + *(double *)(*local_8 + 0x40);
      *(double *)(*local_8 + 0x48) = (double)fVar14 + *(double *)(*local_8 + 0x48);
    }
    ec_00 = (example *)(local_8 + 0x6a2);
    ppiVar8 = v_array<int>::begin((v_array<int> *)ec_00);
    ec_seq_00 = (multi_ex *)*ppiVar8;
    ppiVar8 = v_array<int>::end((v_array<int> *)ec_00);
    pmVar11 = (multi_ex *)*ppiVar8;
    for (; is_test = (undefined1)(in_stack_ffffffffffffffa8 >> 0x38), ec_seq_00 != pmVar11;
        ec_seq_00 = (multi_ex *)
                    ((long)&(ec_seq_00->super__Vector_base<example_*,_std::allocator<example_*>_>).
                            _M_impl.super__Vector_impl_data._M_start + 4)) {
      local_74 = *(int *)&(ec_seq_00->super__Vector_base<example_*,_std::allocator<example_*>_>).
                          _M_impl.super__Vector_impl_data._M_start;
      local_98 = *(undefined8 *)(local_10 + 0x6878);
      local_90 = *(undefined8 *)(local_10 + 0x6880);
      local_88 = *(undefined8 *)(local_10 + 0x6888);
      local_80 = *(undefined8 *)(local_10 + 0x6890);
      (*(code *)local_8[0x6a7])((float)*(uint *)(local_10 + 0x6850),0,local_74);
    }
    if (0 < (int)local_8[0x6a6]) {
      std::__cxx11::string::string(local_b8);
      _Var5 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_240,local_b8,_Var5);
      local_258 = 0;
      while( true ) {
        uVar6 = local_258;
        sVar7 = v_array<COST_SENSITIVE::wclass>::size(&local_48);
        is_test = (undefined1)(in_stack_ffffffffffffffa8 >> 0x38);
        if (sVar7 <= uVar6) break;
        if (local_258 != 0) {
          std::operator<<(&local_230,' ');
        }
        pwVar9 = v_array<COST_SENSITIVE::wclass>::operator[](&local_48,local_258);
        poVar10 = (ostream *)std::ostream::operator<<(&local_230,pwVar9->class_index);
        poVar10 = std::operator<<(poVar10,':');
        pwVar9 = v_array<COST_SENSITIVE::wclass>::operator[](&local_48,local_258);
        std::ostream::operator<<(poVar10,pwVar9->partial_prediction);
        local_258 = local_258 + 1;
      }
      pcVar1 = (code *)local_8[0x6a8];
      lVar2 = local_8[0x6a6];
      std::__cxx11::stringstream::str();
      (*pcVar1)((int)lVar2,local_278);
      std::__cxx11::string::~string(local_278);
      std::__cxx11::stringstream::~stringstream(local_240);
      std::__cxx11::string::~string(local_b8);
    }
    (*(code *)PTR_test_label_00476c80)(local_10 + 0x6828);
    COST_SENSITIVE::print_update
              ((vw *)CONCAT44(fVar14,uVar12),(bool)is_test,ec_00,ec_seq_00,
               SUB81((ulong)pmVar11 >> 0x38,0),(uint32_t)pmVar11);
  }
  return;
}

Assistant:

void output_example(vw& all, example& ec, bool& hit_loss, multi_ex* ec_seq)
{
  COST_SENSITIVE::label& ld = ec.l.cs;
  v_array<COST_SENSITIVE::wclass> costs = ld.costs;

  if (example_is_newline(ec)) return;
  if (COST_SENSITIVE::ec_is_example_header(ec)) return;

  all.sd->total_features += ec.num_features;

  float loss = 0.;

  uint32_t predicted_class = ec.pred.multiclass;

  if (!COST_SENSITIVE::cs_label.test_label(&ec.l))
  {
    for (size_t j=0; j<costs.size(); j++)
    {
      if (hit_loss) break;
      if (predicted_class == costs[j].class_index)
      {
        loss = costs[j].x;
        hit_loss = true;
      }
    }

    all.sd->sum_loss += loss;
    all.sd->sum_loss_since_last_dump += loss;
  }

  for (int sink : all.final_prediction_sink)
    all.print(sink, (float)ec.pred.multiclass, 0, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0) outputStringStream << ' ';
      outputStringStream << costs[i].class_index << ':' << costs[i].partial_prediction;
    }
    //outputStringStream << endl;
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  COST_SENSITIVE::print_update(all, COST_SENSITIVE::cs_label.test_label(&ec.l), ec, ec_seq, false, predicted_class);
}